

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

int __thiscall
cmCTestCoverageHandler::HandleBullseyeCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  string local_698 [32];
  ostringstream local_678 [8];
  ostringstream cmCTestLog_msg_3;
  string local_500 [32];
  ostringstream local_4e0 [8];
  ostringstream cmCTestLog_msg_2;
  string local_368 [32];
  ostringstream local_348 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream cmCTestLog_msg;
  char *covfile;
  cmCTestCoverageHandlerContainer *cont_local;
  cmCTestCoverageHandler *this_local;
  
  pcVar3 = cmsys::SystemTools::GetEnv("COVFILE");
  if ((pcVar3 != (char *)0x0) && (sVar4 = strlen(pcVar3), sVar4 != 0)) {
    std::__cxx11::ostringstream::ostringstream(local_348);
    poVar5 = std::operator<<((ostream *)local_348," run covsrc with COVFILE=[");
    poVar5 = std::operator<<(poVar5,pcVar3);
    poVar5 = std::operator<<(poVar5,"]");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x924,pcVar3,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_368);
    std::__cxx11::ostringstream::~ostringstream(local_348);
    iVar2 = RunBullseyeSourceSummary(this,cont);
    if (iVar2 == 0) {
      std::__cxx11::ostringstream::ostringstream(local_4e0);
      std::operator<<((ostream *)local_4e0,"Error running bullseye summary.\n");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x928,pcVar3,false);
      std::__cxx11::string::~string(local_500);
      std::__cxx11::ostringstream::~ostringstream(local_4e0);
      return 0;
    }
    std::__cxx11::ostringstream::ostringstream(local_678);
    poVar5 = std::operator<<((ostream *)local_678,"HandleBullseyeCoverage return 1 ");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x92c,pcVar3,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_698);
    std::__cxx11::ostringstream::~ostringstream(local_678);
    return 1;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,
                  " COVFILE environment variable not found, not running  bullseye\n");
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x91e,pcVar3,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return 0;
}

Assistant:

int cmCTestCoverageHandler::HandleBullseyeCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  const char* covfile = cmSystemTools::GetEnv("COVFILE");
  if(!covfile || strlen(covfile) == 0)
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
      " COVFILE environment variable not found, not running "
      " bullseye\n", this->Quiet);
    return 0;
    }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
    " run covsrc with COVFILE=["
    << covfile
    << "]" << std::endl, this->Quiet);
  if(!this->RunBullseyeSourceSummary(cont))
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error running bullseye summary.\n");
    return 0;
    }
  cmCTestOptionalLog(this->CTest, DEBUG, "HandleBullseyeCoverage return 1 "
  << std::endl, this->Quiet);
  return 1;
}